

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O3

int __thiscall
cmCTestCoverageHandler::HandleTracePyCoverage
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  ulong uVar1;
  char cVar2;
  pointer pcVar3;
  cmCTest *pcVar4;
  pointer piVar5;
  pointer *__nptr;
  bool bVar6;
  int iVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long *plVar8;
  ostream *poVar9;
  mapped_type *this_00;
  int iVar10;
  long lVar11;
  cmCTestCoverageHandler *this_01;
  iterator __position;
  ulong uVar12;
  _Base_ptr p_Var13;
  string nl;
  string tempDir;
  string daGlob;
  string testingDir;
  string actualSourceFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string fileName;
  ostringstream cmCTestLog_msg_4;
  ostringstream cmCTestLog_msg;
  Glob gl;
  undefined1 local_530 [40];
  string local_508;
  string local_4e8;
  _Base_ptr local_4c8;
  _Base_ptr local_4c0;
  _Base_ptr local_4b8;
  _Base_ptr p_Stack_4b0;
  string local_4a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_488;
  string local_470;
  cmCTestCoverageHandlerContainer *local_450;
  ulong local_448;
  TotalCoverageMap *local_440;
  _Base_ptr local_438;
  cmCTestCoverageHandler *local_430;
  _Base_ptr local_428;
  undefined1 local_418 [16];
  undefined4 local_408;
  undefined4 uStack_404;
  pointer local_3f8 [12];
  ios_base local_398 [264];
  undefined1 local_290 [32];
  byte abStack_270 [80];
  ios_base local_220 [408];
  Glob local_88;
  
  cmsys::Glob::Glob(&local_88);
  local_88.Recurse = true;
  local_88.RecurseThroughSymlinks = false;
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  pcVar3 = (cont->BinaryDir)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4e8,pcVar3,pcVar3 + (cont->BinaryDir)._M_string_length);
  std::__cxx11::string::append((char *)&local_4e8);
  cmsys::Glob::FindFiles(&local_88,&local_4e8,(GlobMessages *)0x0);
  __x = cmsys::Glob::GetFiles_abi_cxx11_(&local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_488,__x);
  if (local_488.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_488.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_290," Cannot find any Python Trace.py coverage files.",0x30);
    std::ios::widen((char)(ostream *)local_290 + (char)*(undefined8 *)(local_290._0_8_ + -0x18));
    std::ostream::put((char)local_290);
    std::ostream::flush();
    pcVar4 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x63c,(char *)CONCAT44(uStack_404,local_408),
                 (this->super_cmCTestGenericHandler).Quiet);
    if ((pointer *)CONCAT44(uStack_404,local_408) != local_3f8) {
      operator_delete((pointer *)CONCAT44(uStack_404,local_408),
                      (ulong)((long)(local_3f8[0]->regmatch).startp + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_290);
    std::ios_base::~ios_base(local_220);
    iVar7 = 0;
  }
  else {
    cmCTest::GetBinaryDir_abi_cxx11_((string *)local_290,(this->super_cmCTestGenericHandler).CTest);
    plVar8 = (long *)std::__cxx11::string::append(local_290);
    local_4c8 = (_Base_ptr)&local_4b8;
    p_Var13 = (_Base_ptr)(plVar8 + 2);
    if ((_Base_ptr)*plVar8 == p_Var13) {
      local_4b8 = *(_Base_ptr *)p_Var13;
      p_Stack_4b0 = (_Base_ptr)plVar8[3];
    }
    else {
      local_4b8 = *(_Base_ptr *)p_Var13;
      local_4c8 = (_Base_ptr)*plVar8;
    }
    local_4c0 = (_Base_ptr)plVar8[1];
    *plVar8 = (long)p_Var13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
      operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
    }
    local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_508,local_4c8,
               (long)&local_4c8->_M_color + (long)&local_4c0->_M_color);
    std::__cxx11::string::append((char *)&local_508);
    uVar12 = 0;
    this_01 = (cmCTestCoverageHandler *)0x0;
    cmsys::SystemTools::MakeDirectory(&local_508,(mode_t *)0x0);
    local_438 = (_Base_ptr)
                local_488.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (local_488.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_488.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_440 = &cont->TotalCoverage;
      uVar12 = 0;
      p_Var13 = (_Base_ptr)
                local_488.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_450 = cont;
      local_430 = this;
      do {
        FindFile(&local_470,this_01,cont,(string *)p_Var13);
        if ((_Base_ptr)local_470._M_string_length == (_Base_ptr)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_290,"Cannot find source Python file corresponding to: ",0x31);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_290,*(char **)p_Var13,(long)p_Var13->_M_parent);
          std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          pcVar4 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar4,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x64b,(char *)CONCAT44(uStack_404,local_408),false);
          if ((pointer *)CONCAT44(uStack_404,local_408) != local_3f8) {
            operator_delete((pointer *)CONCAT44(uStack_404,local_408),
                            (ulong)((long)(local_3f8[0]->regmatch).startp + 1));
          }
          this_01 = (cmCTestCoverageHandler *)&std::__cxx11::ostringstream::VTT;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_290);
          std::ios_base::~ios_base(local_220);
        }
        else {
          cmsys::SystemTools::CollapseFullPath(&local_4a8,&local_470);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_290,"   Check coverage for file: ",0x1c);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_290,local_4a8._M_dataplus._M_p,
                              local_4a8._M_string_length);
          std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          pcVar4 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar4,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x653,(char *)CONCAT44(uStack_404,local_408),
                       (this->super_cmCTestGenericHandler).Quiet);
          local_530._32_8_ = p_Var13;
          if ((pointer *)CONCAT44(uStack_404,local_408) != local_3f8) {
            operator_delete((pointer *)CONCAT44(uStack_404,local_408),
                            (ulong)((long)(local_3f8[0]->regmatch).startp + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_290);
          std::ios_base::~ios_base(local_220);
          this_00 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::operator[](local_440,&local_4a8);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_290,"   in file: ",0xc);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_290,*(char **)local_530._32_8_,
                              (long)*(_Base_ptr *)(local_530._32_8_ + 8));
          std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          pcVar4 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar4,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x657,(char *)CONCAT44(uStack_404,local_408),
                       (this->super_cmCTestGenericHandler).Quiet);
          if ((pointer *)CONCAT44(uStack_404,local_408) != local_3f8) {
            operator_delete((pointer *)CONCAT44(uStack_404,local_408),
                            (ulong)((long)(local_3f8[0]->regmatch).startp + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_290);
          std::ios_base::~ios_base(local_220);
          std::ifstream::ifstream((ostringstream *)local_290,*(char **)local_530._32_8_,_S_in);
          if ((abStack_270[*(long *)(local_290._0_8_ + -0x18)] & 5) == 0) {
            local_530._0_8_ = local_530 + 0x10;
            local_530._8_8_ = 0;
            local_530[0x10] = 0;
            uVar1 = 0xffffffffffffffff;
            local_448 = uVar12;
LAB_00273678:
            uVar12 = uVar1;
            this_01 = (cmCTestCoverageHandler *)local_530;
            bVar6 = cmsys::SystemTools::GetLineFromStream
                              ((istream *)local_290,(string *)this_01,(bool *)0x0,0xffffffffffffffff
                              );
            if (bVar6) {
              uVar1 = uVar12 + 1;
              if (0xb < (ulong)local_530._8_8_) {
                lVar11 = 4;
                do {
                  cVar2 = *(char *)(local_530._0_8_ + lVar11 + 1);
                  if (cVar2 == ' ') goto LAB_0027379b;
                  if (cVar2 == ':') {
                    std::__cxx11::string::substr((ulong)&local_408,(ulong)local_530);
                    __nptr = (pointer *)CONCAT44(uStack_404,local_408);
                    iVar7 = atoi((char *)__nptr);
                    this = local_430;
                    if (__nptr != local_3f8) {
                      operator_delete(__nptr,(ulong)((long)(local_3f8[0]->regmatch).startp + 1));
                      this = local_430;
                    }
                    goto LAB_002737e8;
                  }
                  lVar11 = lVar11 + 1;
                } while (lVar11 != 7);
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_408);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_408,"Currently the limit is maximum coverage of 999999"
                           ,0x31);
                cVar2 = (char)(ostringstream *)&local_408;
                std::ios::widen((char)*(undefined8 *)(CONCAT44(uStack_404,local_408) + -0x18) +
                                cVar2);
                std::ostream::put(cVar2);
                std::ostream::flush();
                pcVar4 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar4,7,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                             ,0x680,(char *)local_428,false);
                if (local_428 != (_Base_ptr)local_418) {
                  operator_delete(local_428,local_418._0_8_ + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_408);
                std::ios_base::~ios_base(local_398);
LAB_0027379b:
                iVar7 = 0;
LAB_002737e8:
                do {
                  piVar5 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start;
                  __position._M_current =
                       (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
                  while( true ) {
                    if (uVar1 < (ulong)((long)__position._M_current - (long)piVar5 >> 2)) {
                      iVar10 = piVar5[uVar12 + 1];
                      if (-1 < iVar7 && iVar10 < 0) {
                        piVar5[uVar12 + 1] = 0;
                        iVar10 = 0;
                      }
                      piVar5[uVar12 + 1] = iVar10 + iVar7;
                      goto LAB_00273678;
                    }
                    local_408 = 0xffffffff;
                    if (__position._M_current ==
                        (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_end_of_storage) break;
                    *__position._M_current = -1;
                    __position._M_current = __position._M_current + 1;
                    (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish = __position._M_current;
                  }
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            (this_00,__position,(int *)&local_408);
                } while( true );
              }
              goto LAB_00273678;
            }
            cont = local_450;
            uVar12 = local_448;
            p_Var13 = (_Base_ptr)local_530._32_8_;
            if ((undefined1 *)local_530._0_8_ != local_530 + 0x10) {
              this_01 = (cmCTestCoverageHandler *)(CONCAT71(local_530._17_7_,local_530[0x10]) + 1);
              operator_delete((void *)local_530._0_8_,(ulong)this_01);
              cont = local_450;
              uVar12 = local_448;
              p_Var13 = (_Base_ptr)local_530._32_8_;
            }
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_408);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_408,"Cannot open file: ",0x12);
            p_Var13 = (_Base_ptr)local_530._32_8_;
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&local_408,*(char **)local_530._32_8_,
                                (long)*(_Base_ptr *)(local_530._32_8_ + 8));
            std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            pcVar4 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar4,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x65b,(char *)local_530._0_8_,false);
            if ((undefined1 *)local_530._0_8_ != local_530 + 0x10) {
              operator_delete((void *)local_530._0_8_,CONCAT71(local_530._17_7_,local_530[0x10]) + 1
                             );
            }
            this_01 = (cmCTestCoverageHandler *)&std::__cxx11::ostringstream::VTT;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_408);
            std::ios_base::~ios_base(local_398);
          }
          std::ifstream::~ifstream(local_290);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
            this_01 = (cmCTestCoverageHandler *)(local_4a8.field_2._M_allocated_capacity + 1);
            operator_delete(local_4a8._M_dataplus._M_p,(ulong)this_01);
          }
          uVar12 = (ulong)((int)uVar12 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_470._M_dataplus._M_p != &local_470.field_2) {
          this_01 = (cmCTestCoverageHandler *)(local_470.field_2._M_allocated_capacity + 1);
          operator_delete(local_470._M_dataplus._M_p,(ulong)this_01);
        }
        p_Var13 = p_Var13 + 1;
      } while (p_Var13 != local_438);
    }
    iVar7 = (int)uVar12;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != &local_508.field_2) {
      operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
    }
    if (local_4c8 != (_Base_ptr)&local_4b8) {
      operator_delete(local_4c8,(ulong)((long)&local_4b8->_M_color + 1));
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_488);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  cmsys::Glob::~Glob(&local_88);
  return iVar7;
}

Assistant:

int cmCTestCoverageHandler::HandleTracePyCoverage(
  cmCTestCoverageHandlerContainer* cont)
{
  cmsys::Glob gl;
  gl.RecurseOn();
  gl.RecurseThroughSymlinksOff();
  std::string daGlob = cont->BinaryDir + "/*.cover";
  gl.FindFiles(daGlob);
  std::vector<std::string> files = gl.GetFiles();

  if (files.empty()) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " Cannot find any Python Trace.py coverage files."
                         << std::endl,
                       this->Quiet);
    // No coverage files is a valid thing, so the exit code is 0
    return 0;
  }

  std::string testingDir = this->CTest->GetBinaryDir() + "/Testing";
  std::string tempDir = testingDir + "/CoverageInfo";
  cmSystemTools::MakeDirectory(tempDir);

  int file_count = 0;
  for (std::string const& file : files) {
    std::string fileName = this->FindFile(cont, file);
    if (fileName.empty()) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Cannot find source Python file corresponding to: "
                   << file << std::endl);
      continue;
    }

    std::string actualSourceFile = cmSystemTools::CollapseFullPath(fileName);
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "   Check coverage for file: " << actualSourceFile
                                                      << std::endl,
                       this->Quiet);
    cmCTestCoverageHandlerContainer::SingleFileCoverageVector* vec =
      &cont->TotalCoverage[actualSourceFile];
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "   in file: " << file << std::endl, this->Quiet);
    cmsys::ifstream ifile(file.c_str());
    if (!ifile) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Cannot open file: " << file << std::endl);
    } else {
      long cnt = -1;
      std::string nl;
      while (cmSystemTools::GetLineFromStream(ifile, nl)) {
        cnt++;

        // Skip empty lines
        if (nl.empty()) {
          continue;
        }

        // Skip unused lines
        if (nl.size() < 12) {
          continue;
        }

        // Read the coverage count from the beginning of the Trace.py output
        // line
        std::string::size_type pos;
        int cov = 0;
        // This is a hack. We should really do something more elaborate
        for (pos = 5; pos < 8; pos++) {
          if (nl[pos] == ' ') {
            // This line does not have ':' so no coverage here. That said,
            // Trace.py does not handle not covered lines versus comments etc.
            // So, this will be set to 0.
            break;
          }
          if (nl[pos] == ':') {
            cov = atoi(nl.substr(0, pos - 1).c_str());
            break;
          }
        }
        if (pos == 8) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Currently the limit is maximum coverage of 999999"
                       << std::endl);
        }
        // Read the line number starting at the 10th character of the gcov
        // output line
        long lineIdx = cnt;
        if (lineIdx >= 0) {
          while (vec->size() <= static_cast<size_t>(lineIdx)) {
            vec->push_back(-1);
          }
          // Initially all entries are -1 (not used). If we get coverage
          // information, increment it to 0 first.
          if ((*vec)[lineIdx] < 0) {
            if (cov >= 0) {
              (*vec)[lineIdx] = 0;
            }
          }
          (*vec)[lineIdx] += cov;
        }
      }
    }
    ++file_count;
  }
  return file_count;
}